

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-uri.cpp
# Opt level: O2

void __thiscall nlohmann::json_uri::update(json_uri *this,string *uri)

{
  string *this_00;
  long lVar1;
  ulong uVar2;
  long lVar3;
  invalid_argument *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> location;
  string pointer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pointer,"",(allocator<char> *)&location);
  lVar1 = std::__cxx11::string::find((char)uri,0x23);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&location,(ulong)uri);
    std::__cxx11::string::operator=((string *)&pointer,(string *)&location);
    std::__cxx11::string::~string((string *)&location);
    while (uVar2 = std::__cxx11::string::rfind((char)&pointer,0x25), uVar2 != 0xffffffffffffffff) {
      if (uVar2 < pointer._M_string_length - 2) {
        std::__cxx11::string::substr((ulong)&location,(ulong)&pointer);
        strtoul(location._M_dataplus._M_p,(char **)0x0,0x10);
        std::__cxx11::string::replace((ulong)&pointer,uVar2,3,'\x01');
        std::__cxx11::string::~string((string *)&location);
      }
    }
  }
  std::__cxx11::string::substr((ulong)&location,(ulong)uri);
  if (location._M_string_length != 0) {
    lVar1 = std::__cxx11::string::find((char *)&location,0x138138);
    if (lVar1 == 0) {
      std::__cxx11::string::_M_assign((string *)this);
      std::__cxx11::string::assign((char *)&this->scheme_);
      std::__cxx11::string::assign((char *)&this->authority_);
      std::__cxx11::string::assign((char *)&this->path_);
    }
    else {
      lVar3 = std::__cxx11::string::find((char *)&location,0x13813d);
      lVar1 = 0;
      if (lVar3 != -1) {
        std::__cxx11::string::assign((char *)this);
        std::__cxx11::string::substr((ulong)&path,(ulong)&location);
        std::__cxx11::string::operator=((string *)&this->scheme_,(string *)&path);
        std::__cxx11::string::~string((string *)&path);
        lVar1 = lVar3 + 3;
        lVar3 = std::__cxx11::string::find((char *)&location,0x13813f);
        if (lVar3 != -1) {
          std::__cxx11::string::substr((ulong)&path,(ulong)&location);
          std::__cxx11::string::operator=((string *)&this->authority_,(string *)&path);
          std::__cxx11::string::~string((string *)&path);
          lVar1 = lVar3;
        }
      }
      std::__cxx11::string::substr((ulong)&path,(ulong)&location);
      if (((this->urn_)._M_string_length != 0) && (path._M_string_length != 0)) {
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"Cannot add a path (",&path);
        std::operator+(&local_b0,&local_50,") to an URN URI (");
        std::operator+(&local_90,&local_b0,&this->urn_);
        std::operator+(&local_70,&local_90,")");
        std::invalid_argument::invalid_argument(this_01,(string *)&local_70);
        __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      if (*path._M_dataplus._M_p == '/') {
        std::__cxx11::string::_M_assign((string *)&this->path_);
      }
      else {
        this_00 = &this->path_;
        if (lVar1 == 0) {
          std::__cxx11::string::rfind((char)this_00,0x2f);
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)this_00);
          std::operator+(&local_90,&local_b0,'/');
          std::operator+(&local_70,&local_90,&path);
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else {
          std::__cxx11::string::append((string *)this_00);
        }
      }
      std::__cxx11::string::~string((string *)&path);
    }
  }
  json_abi_v3_11_2::literals::json_literals::operator____json_pointer_abi_cxx11_
            ((json_pointer *)&path,"",0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&(this->pointer_).reference_tokens,&path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&path);
  std::__cxx11::string::assign((char *)&this->identifier_);
  if (*pointer._M_dataplus._M_p == '/') {
    json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&path,&pointer);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&(this->pointer_).reference_tokens,&path);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&path);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->identifier_);
  }
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&pointer);
  return;
}

Assistant:

void json_uri::update(const std::string &uri)
{
	std::string pointer = ""; // default pointer is document-root

	// first split the URI into location and pointer
	auto pointer_separator = uri.find('#');
	if (pointer_separator != std::string::npos) {    // and extract the pointer-string if found
		pointer = uri.substr(pointer_separator + 1); // remove #

		// unescape %-values IOW, decode JSON-URI-formatted JSON-pointer
		std::size_t pos = pointer.size() - 1;
		do {
			pos = pointer.rfind('%', pos);
			if (pos == std::string::npos)
				break;

			if (pos >= pointer.size() - 2) {
				pos--;
				continue;
			}

			std::string hex = pointer.substr(pos + 1, 2);
			char ascii = static_cast<char>(std::strtoul(hex.c_str(), nullptr, 16));
			pointer.replace(pos, 3, 1, ascii);

			pos--;
		} while (1);
	}

	auto location = uri.substr(0, pointer_separator);

	if (location.size()) { // a location part has been found

		// if it is an URN take it as it is
		if (location.find("urn:") == 0) {
			urn_ = location;

			// and clear URL members
			scheme_ = "";
			authority_ = "";
			path_ = "";

		} else { // it is an URL

			// split URL in protocol, hostname and path
			std::size_t pos = 0;
			auto proto = location.find("://", pos);
			if (proto != std::string::npos) { // extract the protocol

				urn_ = ""; // clear URN-member if URL is parsed

				scheme_ = location.substr(pos, proto - pos);
				pos = 3 + proto; // 3 == "://"

				auto authority = location.find("/", pos);
				if (authority != std::string::npos) { // and the hostname (no proto without hostname)
					authority_ = location.substr(pos, authority - pos);
					pos = authority;
				}
			}

			auto path = location.substr(pos);

			// URNs cannot of have paths
			if (urn_.size() && path.size())
				throw std::invalid_argument("Cannot add a path (" + path + ") to an URN URI (" + urn_ + ")");

			if (path[0] == '/') // if it starts with a / it is root-path
				path_ = path;
			else if (pos == 0) { // the URL contained only a path and the current path has no / at the end, strip last element until / and append
				auto last_slash = path_.rfind('/');
				path_ = path_.substr(0, last_slash) + '/' + path;
			} else // otherwise it is a subfolder
				path_.append(path);
		}
	}

	pointer_ = ""_json_pointer;
	identifier_ = "";

	if (pointer[0] == '/')
		pointer_ = json::json_pointer(pointer);
	else
		identifier_ = pointer;
}